

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

string * __thiscall
gl3cts::TextureSwizzle::SmokeTest::getVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,SmokeTest *this,testCase *test_case,bool is_tested_stage)

{
  GLchar *text;
  size_t local_88;
  size_t position;
  _texture_target *target;
  _texture_format *source_format;
  GLchar *channel;
  _texture_access *access;
  string local_50;
  string *local_30;
  string *arguments;
  testCase *ptStack_20;
  bool is_tested_stage_local;
  testCase *test_case_local;
  SmokeTest *this_local;
  string *vs;
  
  arguments._6_1_ = 0;
  arguments._7_1_ = is_tested_stage;
  ptStack_20 = test_case;
  test_case_local = (testCase *)this;
  this_local = (SmokeTest *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if ((arguments._7_1_ & 1) == 0) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,getVertexShader::vs_blank_template);
  }
  else {
    prepareArguments_abi_cxx11_(&local_50,this,ptStack_20);
    local_30 = &local_50;
    channel = texture_access + ptStack_20->m_texture_access_index * 0x18;
    source_format = *(_texture_format **)(channels + ptStack_20->m_channel_index * 8);
    target = (_texture_target *)(texture_formats + ptStack_20->m_source_texture_format_index * 0x78)
    ;
    position = (size_t)(texture_targets + ptStack_20->m_source_texture_target_index * 0x30);
    local_88 = 0;
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,getVertexShader::vs_test_template);
    Utils::replaceToken("PREFIX",&local_88,*(GLchar **)(target->m_sampler_type + 8),
                        __return_storage_ptr__);
    Utils::replaceToken("SAMPLER_TYPE",&local_88,*(GLchar **)(position + 0x18),
                        __return_storage_ptr__);
    Utils::replaceToken("BASIC_TYPE",&local_88,*(GLchar **)target->m_sampler_type,
                        __return_storage_ptr__);
    Utils::replaceToken("TEXTURE_ACCESS",&local_88,*(GLchar **)channel,__return_storage_ptr__);
    text = (GLchar *)std::__cxx11::string::c_str();
    Utils::replaceToken("ARGUMENTS",&local_88,text,__return_storage_ptr__);
    Utils::replaceToken("CHANNEL",&local_88,(GLchar *)source_format,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SmokeTest::getVertexShader(const testCase& test_case, bool is_tested_stage)
{
	static const glw::GLchar* vs_blank_template = "#version 330 core\n"
												  "\n"
												  "void main()\n"
												  "{\n"
												  "    switch (gl_VertexID)\n"
												  "    {\n"
												  "      case 0: gl_Position = vec4(-1.0, 1.0, 0.0, 1.0); break; \n"
												  "      case 1: gl_Position = vec4( 1.0, 1.0, 0.0, 1.0); break; \n"
												  "      case 2: gl_Position = vec4(-1.0,-1.0, 0.0, 1.0); break; \n"
												  "      case 3: gl_Position = vec4( 1.0,-1.0, 0.0, 1.0); break; \n"
												  "    }\n"
												  "}\n"
												  "\n";

	static const glw::GLchar* vs_test_template = "#version 330 core\n"
												 "\n"
												 "uniform PREFIXsamplerSAMPLER_TYPE sampler;\n"
												 "\n"
												 "flat out BASIC_TYPE result;\n"
												 "\n"
												 "void main()\n"
												 "{\n"
												 "    result = TEXTURE_ACCESS(sampler, ARGUMENTS).CHANNEL;\n"
												 "\n"
												 "    switch (gl_VertexID)\n"
												 "    {\n"
												 "      case 0: gl_Position = vec4(-1.0, 1.0, 0.0, 1.0); break; \n"
												 "      case 1: gl_Position = vec4( 1.0, 1.0, 0.0, 1.0); break; \n"
												 "      case 2: gl_Position = vec4(-1.0,-1.0, 0.0, 1.0); break; \n"
												 "      case 3: gl_Position = vec4( 1.0,-1.0, 0.0, 1.0); break; \n"
												 "    }\n"
												 "}\n"
												 "\n";

	std::string vs;

	if (is_tested_stage)
	{
		/* */
		const std::string&	 arguments	 = prepareArguments(test_case);
		const _texture_access& access		 = texture_access[test_case.m_texture_access_index];
		const glw::GLchar*	 channel		 = channels[test_case.m_channel_index];
		const _texture_format& source_format = texture_formats[test_case.m_source_texture_format_index];
		const _texture_target& target		 = texture_targets[test_case.m_source_texture_target_index];

		size_t position = 0;

		vs = vs_test_template;

		Utils::replaceToken("PREFIX", position, source_format.m_sampler.m_sampler_prefix, vs);
		Utils::replaceToken("SAMPLER_TYPE", position, target.m_sampler_type, vs);
		Utils::replaceToken("BASIC_TYPE", position, source_format.m_sampler.m_basic_type, vs);
		Utils::replaceToken("TEXTURE_ACCESS", position, access.m_name, vs);
		Utils::replaceToken("ARGUMENTS", position, arguments.c_str(), vs);
		Utils::replaceToken("CHANNEL", position, channel, vs);
	}
	else
	{
		vs = vs_blank_template;
	}

	return vs;
}